

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

bool __thiscall llvm::DWARFVerifier::handleAccelTables(DWARFVerifier *this)

{
  DWARFObject *pDVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined1 local_40 [8];
  DataExtractor StrData;
  
  pDVar1 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  iVar2 = (*pDVar1->_vptr_DWARFObject[0x11])(pDVar1);
  iVar3 = (*((this->DCtx->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[5])();
  StrData.Data.Length._0_1_ = (undefined1)iVar3;
  StrData.Data.Length._1_1_ = 0;
  local_40 = (undefined1  [8])CONCAT44(extraout_var,iVar2);
  iVar2 = (*pDVar1->_vptr_DWARFObject[0x24])(pDVar1);
  if (*(long *)(CONCAT44(extraout_var_00,iVar2) + 8) == 0) {
    uVar4 = 0;
  }
  else {
    iVar2 = (*pDVar1->_vptr_DWARFObject[0x24])(pDVar1);
    uVar4 = verifyAppleAccelTable
                      (this,(DWARFSection *)CONCAT44(extraout_var_01,iVar2),
                       (DataExtractor *)local_40,".apple_names");
  }
  iVar2 = (*pDVar1->_vptr_DWARFObject[0x25])(pDVar1);
  if (*(long *)(CONCAT44(extraout_var_02,iVar2) + 8) != 0) {
    iVar2 = (*pDVar1->_vptr_DWARFObject[0x25])(pDVar1);
    uVar5 = verifyAppleAccelTable
                      (this,(DWARFSection *)CONCAT44(extraout_var_03,iVar2),
                       (DataExtractor *)local_40,".apple_types");
    uVar4 = uVar4 + uVar5;
  }
  iVar2 = (*pDVar1->_vptr_DWARFObject[0x26])(pDVar1);
  if (*(long *)(CONCAT44(extraout_var_04,iVar2) + 8) != 0) {
    iVar2 = (*pDVar1->_vptr_DWARFObject[0x26])(pDVar1);
    uVar5 = verifyAppleAccelTable
                      (this,(DWARFSection *)CONCAT44(extraout_var_05,iVar2),
                       (DataExtractor *)local_40,".apple_namespaces");
    uVar4 = uVar4 + uVar5;
  }
  iVar2 = (*pDVar1->_vptr_DWARFObject[0x28])(pDVar1);
  if (*(long *)(CONCAT44(extraout_var_06,iVar2) + 8) != 0) {
    iVar2 = (*pDVar1->_vptr_DWARFObject[0x28])(pDVar1);
    uVar5 = verifyAppleAccelTable
                      (this,(DWARFSection *)CONCAT44(extraout_var_07,iVar2),
                       (DataExtractor *)local_40,".apple_objc");
    uVar4 = uVar4 + uVar5;
  }
  iVar2 = (*pDVar1->_vptr_DWARFObject[0x27])(pDVar1);
  if (*(long *)(CONCAT44(extraout_var_08,iVar2) + 8) != 0) {
    iVar2 = (*pDVar1->_vptr_DWARFObject[0x27])(pDVar1);
    uVar5 = verifyDebugNames(this,(DWARFSection *)CONCAT44(extraout_var_09,iVar2),
                             (DataExtractor *)local_40);
    uVar4 = uVar4 + uVar5;
  }
  return uVar4 == 0;
}

Assistant:

bool DWARFVerifier::handleAccelTables() {
  const DWARFObject &D = DCtx.getDWARFObj();
  DataExtractor StrData(D.getStrSection(), DCtx.isLittleEndian(), 0);
  unsigned NumErrors = 0;
  if (!D.getAppleNamesSection().Data.empty())
    NumErrors += verifyAppleAccelTable(&D.getAppleNamesSection(), &StrData,
                                       ".apple_names");
  if (!D.getAppleTypesSection().Data.empty())
    NumErrors += verifyAppleAccelTable(&D.getAppleTypesSection(), &StrData,
                                       ".apple_types");
  if (!D.getAppleNamespacesSection().Data.empty())
    NumErrors += verifyAppleAccelTable(&D.getAppleNamespacesSection(), &StrData,
                                       ".apple_namespaces");
  if (!D.getAppleObjCSection().Data.empty())
    NumErrors += verifyAppleAccelTable(&D.getAppleObjCSection(), &StrData,
                                       ".apple_objc");

  if (!D.getNamesSection().Data.empty())
    NumErrors += verifyDebugNames(D.getNamesSection(), StrData);
  return NumErrors == 0;
}